

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Pointer ft_service_list_lookup(FT_ServiceDesc service_descriptors,char *service_id)

{
  int iVar1;
  FT_ServiceDesc local_28;
  FT_ServiceDesc desc;
  FT_Pointer result;
  char *service_id_local;
  FT_ServiceDesc service_descriptors_local;
  
  if ((service_descriptors != (FT_ServiceDesc)0x0) &&
     (local_28 = service_descriptors, service_id != (char *)0x0)) {
    for (; local_28->serv_id != (char *)0x0; local_28 = local_28 + 1) {
      iVar1 = strcmp(local_28->serv_id,service_id);
      if (iVar1 == 0) {
        return local_28->serv_data;
      }
    }
  }
  return (FT_Pointer)0x0;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_service_list_lookup( FT_ServiceDesc  service_descriptors,
                          const char*     service_id )
  {
    FT_Pointer      result = NULL;
    FT_ServiceDesc  desc   = service_descriptors;


    if ( desc && service_id )
    {
      for ( ; desc->serv_id != NULL; desc++ )
      {
        if ( ft_strcmp( desc->serv_id, service_id ) == 0 )
        {
          result = (FT_Pointer)desc->serv_data;
          break;
        }
      }
    }

    return result;
  }